

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O0

int trico_less_vertices(float *left,float *right)

{
  float *right_local;
  float *left_local;
  
  if ((*left != *right) || (NAN(*left) || NAN(*right))) {
    left_local._4_4_ = (uint)(*left < *right);
  }
  else if ((left[1] != right[1]) || (NAN(left[1]) || NAN(right[1]))) {
    left_local._4_4_ = (uint)(left[1] < right[1]);
  }
  else {
    left_local._4_4_ = (uint)(left[2] < right[2]);
  }
  return left_local._4_4_;
}

Assistant:

static inline int trico_less_vertices(float* left, float* right)
  {
  if (left[0] == right[0])
    {
    if (left[1] == right[1])
      return left[2] < right[2] ? 1 : 0;
    else
      return left[1] < right[1] ? 1 : 0;
    }
  else
    return left[0] < right[0] ? 1 : 0;
  }